

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O0

void rw::AnimInterpolatorInfo::unregisterInterp(AnimInterpolatorInfo *interpInfo)

{
  int local_14;
  int32 i;
  AnimInterpolatorInfo *interpInfo_local;
  
  local_14 = 0;
  while( true ) {
    if (9 < local_14) {
      return;
    }
    if (*(AnimInterpolatorInfo **)(interpInfoList + (long)local_14 * 8) == interpInfo) break;
    local_14 = local_14 + 1;
  }
  (*DAT_001660a8)(*(undefined8 *)(interpInfoList + (long)local_14 * 8));
  *(undefined8 *)(interpInfoList + (long)local_14 * 8) = 0;
  return;
}

Assistant:

void
AnimInterpolatorInfo::unregisterInterp(AnimInterpolatorInfo *interpInfo)
{
	for(int32 i = 0; i < MAXINTERPINFO; i++)
		if(interpInfoList[i] == interpInfo){
			rwFree(interpInfoList[i]);
			interpInfoList[i] = nil;
			return;
		}
}